

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiID IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  GImGui->NavLayer = layer;
  pIVar2 = pIVar3->NavWindow;
  window = pIVar2;
  if (layer == ImGuiNavLayer_Main) {
    window = pIVar2->NavLastChildNavWindow;
    if ((window == (ImGuiWindow *)0x0) || (window->WasActive == false)) {
      window = pIVar2;
    }
    pIVar3->NavWindow = window;
    IVar1 = window->NavLastIds[0];
    if (IVar1 != 0) {
      pIVar3->NavId = IVar1;
      pIVar3->NavFocusScopeId = 0;
      window->NavLastIds[0] = IVar1;
      pIVar3->NavMousePosDirty = true;
      pIVar3->NavDisableHighlight = false;
      pIVar3->NavDisableMouseHover = true;
      return;
    }
  }
  ImGui::NavInitWindow(window,true);
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (layer == 0 && window->NavLastIds[0] != 0)
        ImGui::SetNavIDWithRectRel(window->NavLastIds[0], layer, 0, window->NavRectRel[0]);
    else
        ImGui::NavInitWindow(window, true);
}